

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void textui_cmd_ignore_menu(object *obj)

{
  uint32_t *puVar1;
  bitflag *pbVar2;
  _Bool _Var3;
  byte bVar4;
  uint8_t uVar5;
  ignore_type_t iVar6;
  int iVar7;
  menu *m;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  byte bVar11;
  bool bVar12;
  region_conflict r;
  ego_desc choice;
  char out_val [160];
  
  if (obj == (object *)0x0) {
    return;
  }
  m = menu_dynamic_new();
  m->selections = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
  bVar12 = (obj->known->notice & 4) != 0;
  if (bVar12) {
    pcVar10 = "Unignore this item";
  }
  else {
    pcVar10 = "This item only";
  }
  menu_dynamic_add(m,pcVar10,(uint)bVar12);
  _Var3 = ignore_tval((uint)obj->tval);
  if ((!_Var3) ||
     ((obj->artifact != (artifact *)0x0 && (_Var3 = object_flavor_is_aware(obj), _Var3))))
  goto LAB_001d220f;
  _Var3 = kind_is_ignored_aware(obj->kind);
  if (_Var3) {
    object_desc((char *)&r,0x46,obj,0x208,player);
LAB_001d21d5:
    iVar7 = 3;
    pcVar10 = "Unignore all %s";
  }
  else {
    _Var3 = kind_is_ignored_unaware(obj->kind);
    object_desc((char *)&r,0x46,obj,0x208,player);
    if (_Var3) goto LAB_001d21d5;
    iVar7 = 2;
    pcVar10 = "All %s";
  }
  strnfmt(out_val,0xa0,pcVar10,&r);
  menu_dynamic_add(m,out_val,iVar7);
LAB_001d220f:
  iVar6 = ignore_type_of(obj);
  if (iVar6 != ITYPE_MAX && obj->known->ego != (ego_item *)0x0) {
    r.col = L'\0';
    r.row = L'\0';
    r.width = L'\0';
    r.page_rows = L'\0';
    choice.e_idx = (int16_t)obj->ego->eidx;
    choice.itype = (uint16_t)iVar6;
    choice.short_name = "";
    ego_item_name((char *)&r,0x50,&choice);
    _Var3 = ego_is_ignored((int)choice.e_idx,(uint)choice.itype);
    pcVar10 = "All %s";
    if (_Var3) {
      pcVar10 = "Unignore all %s";
    }
    strnfmt(out_val,0xa0,pcVar10,&r.row);
    menu_dynamic_add(m,out_val,_Var3 | 4);
  }
  bVar4 = ignore_level_of(obj);
  _Var3 = tval_is_jewelry(obj);
  bVar11 = bVar4;
  if (_Var3) {
    uVar5 = ignore_level_of(obj);
    bVar11 = 5;
    if (uVar5 == '\x01') {
      bVar11 = bVar4;
    }
  }
  if (bVar11 != 5 && iVar6 != ITYPE_MAX) {
    pcVar10 = quality_values[bVar11].name;
    pcVar8 = ignore_name_for_type(iVar6);
    strnfmt(out_val,0xa0,"All %s %s",pcVar10,pcVar8);
    menu_dynamic_add(m,out_val,6);
  }
  sVar9 = menu_dynamic_longest_entry(m);
  r.row = L'\x01';
  r.col = L'K' - (int)sVar9;
  r.page_rows = m->count;
  r.width = (int)sVar9 + L'\x05';
  screen_save();
  menu_layout(m,(region *)&r);
  region_erase_bordered(&r);
  prt("(Enter to select, ESC) Ignore:",L'\0',L'\0');
  iVar7 = menu_dynamic_select(m);
  screen_load();
  switch(iVar7) {
  case 0:
    pbVar2 = &obj->known->notice;
    *pbVar2 = *pbVar2 | 4;
    break;
  case 1:
    pbVar2 = &obj->known->notice;
    *pbVar2 = *pbVar2 & 0xfb;
    break;
  case 2:
    object_ignore_flavor_of(obj);
    break;
  case 3:
    kind_ignore_clear(obj->kind);
    break;
  case 4:
    ego_ignore(obj);
    break;
  case 5:
    ego_ignore_clear(obj);
    break;
  case 6:
    uVar5 = ignore_level_of(obj);
    iVar6 = ignore_type_of(obj);
    ignore_level[(int)iVar6] = uVar5;
  }
  puVar1 = &player->upkeep->notice;
  *puVar1 = *puVar1 | 2;
  menu_dynamic_free(m);
  return;
}

Assistant:

void textui_cmd_ignore_menu(struct object *obj)
{
	char out_val[160];

	struct menu *m;
	region r;
	int selected;
	uint8_t value;
	int type;

	if (!obj)
		return;

	m = menu_dynamic_new();
	m->selections = all_letters_nohjkl;

	/* Basic ignore option */
	if (!(obj->known->notice & OBJ_NOTICE_IGNORE)) {
		menu_dynamic_add(m, "This item only", IGNORE_THIS_ITEM);
	} else {
		menu_dynamic_add(m, "Unignore this item", UNIGNORE_THIS_ITEM);
	}

	/* Flavour-aware ignore */
	if (ignore_tval(obj->tval) &&
			(!obj->artifact || !object_flavor_is_aware(obj))) {
		bool ignored = kind_is_ignored_aware(obj->kind) ||
				kind_is_ignored_unaware(obj->kind);

		char tmp[70];
		object_desc(tmp, sizeof(tmp), obj,
			ODESC_NOEGO | ODESC_BASE | ODESC_PLURAL, player);
		if (!ignored) {
			strnfmt(out_val, sizeof out_val, "All %s", tmp);
			menu_dynamic_add(m, out_val, IGNORE_THIS_FLAVOR);
		} else {
			strnfmt(out_val, sizeof out_val, "Unignore all %s", tmp);
			menu_dynamic_add(m, out_val, UNIGNORE_THIS_FLAVOR);
		}
	}

	type = ignore_type_of(obj);

	/* Ego ignoring */
	if (obj->known->ego && type != ITYPE_MAX) {
		struct ego_desc choice;
		struct ego_item *ego = obj->ego;
		char tmp[80] = "";

		choice.e_idx = ego->eidx;
		choice.itype = type;
		choice.short_name = "";
		(void) ego_item_name(tmp, sizeof(tmp), &choice);
		if (!ego_is_ignored(choice.e_idx, choice.itype)) {
			strnfmt(out_val, sizeof out_val, "All %s", tmp + 4);
			menu_dynamic_add(m, out_val, IGNORE_THIS_EGO);
		} else {
			strnfmt(out_val, sizeof out_val, "Unignore all %s", tmp + 4);
			menu_dynamic_add(m, out_val, UNIGNORE_THIS_EGO);
		}
	}

	/* Quality ignoring */
	value = ignore_level_of(obj);

	if (tval_is_jewelry(obj) &&	ignore_level_of(obj) != IGNORE_BAD)
		value = IGNORE_MAX;

	if (value != IGNORE_MAX && type != ITYPE_MAX) {
		strnfmt(out_val, sizeof out_val, "All %s %s",
				quality_values[value].name, ignore_name_for_type(type));

		menu_dynamic_add(m, out_val, IGNORE_THIS_QUALITY);
	}

	/* Work out display region */
	r.width = menu_dynamic_longest_entry(m) + 3 + 2; /* +3 for tag, 2 for pad */
	r.col = 80 - r.width;
	r.row = 1;
	r.page_rows = m->count;

	screen_save();
	menu_layout(m, &r);
	region_erase_bordered(&r);

	prt("(Enter to select, ESC) Ignore:", 0, 0);
	selected = menu_dynamic_select(m);

	screen_load();

	if (selected == IGNORE_THIS_ITEM) {
		obj->known->notice |= OBJ_NOTICE_IGNORE;
	} else if (selected == UNIGNORE_THIS_ITEM) {
		obj->known->notice &= ~(OBJ_NOTICE_IGNORE);
	} else if (selected == IGNORE_THIS_FLAVOR) {
		object_ignore_flavor_of(obj);
	} else if (selected == UNIGNORE_THIS_FLAVOR) {
		kind_ignore_clear(obj->kind);
	} else if (selected == IGNORE_THIS_EGO) {
		ego_ignore(obj);
	} else if (selected == UNIGNORE_THIS_EGO) {
		ego_ignore_clear(obj);
	} else if (selected == IGNORE_THIS_QUALITY) {
		uint8_t ignore_value = ignore_level_of(obj);
		int ignore_type = ignore_type_of(obj);

		ignore_level[ignore_type] = ignore_value;
	}

	player->upkeep->notice |= PN_IGNORE;

	menu_dynamic_free(m);
}